

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O3

void iadst16_low8_ssse3(__m128i *input,__m128i *output)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  __m128i alVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  __m128i alVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar86 [16];
  __m128i alVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  __m128i alVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar107 [16];
  __m128i alVar108;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  __m128i alVar137;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  longlong local_78;
  longlong lStack_70;
  longlong local_68;
  longlong lStack_60;
  longlong local_18;
  longlong lStack_10;
  undefined1 auVar7 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  
  auVar37 = pshuflw(ZEXT416(0x648),ZEXT416(0x648),0);
  uVar1 = auVar37._0_4_;
  auVar56._4_4_ = uVar1;
  auVar56._0_4_ = uVar1;
  auVar56._8_4_ = uVar1;
  auVar56._12_4_ = uVar1;
  auVar37 = pshuflw(ZEXT416(0xffff8028),ZEXT416(0xffff8028),0);
  auVar38._0_4_ = auVar37._0_4_;
  auVar38._4_4_ = auVar38._0_4_;
  auVar38._8_4_ = auVar38._0_4_;
  auVar38._12_4_ = auVar38._0_4_;
  auVar57 = pmulhrsw(auVar56,(undefined1  [16])*input);
  auVar39 = pmulhrsw(auVar38,(undefined1  [16])*input);
  auVar37 = pshuflw(ZEXT416(0x1f18),ZEXT416(0x1f18),0);
  uVar1 = auVar37._0_4_;
  auVar98._4_4_ = uVar1;
  auVar98._0_4_ = uVar1;
  auVar98._8_4_ = uVar1;
  auVar98._12_4_ = uVar1;
  auVar37 = pshuflw(ZEXT416(0xffff83d8),ZEXT416(0xffff83d8),0);
  uVar1 = auVar37._0_4_;
  auVar138._4_4_ = uVar1;
  auVar138._0_4_ = uVar1;
  auVar138._8_4_ = uVar1;
  auVar138._12_4_ = uVar1;
  auVar99 = pmulhrsw(auVar98,(undefined1  [16])input[2]);
  auVar139 = pmulhrsw(auVar138,(undefined1  [16])input[2]);
  auVar37 = pshuflw(ZEXT416(0x36b8),ZEXT416(0x36b8),0);
  uVar1 = auVar37._0_4_;
  auVar63._4_4_ = uVar1;
  auVar63._0_4_ = uVar1;
  auVar63._8_4_ = uVar1;
  auVar63._12_4_ = uVar1;
  auVar37 = pshuflw(ZEXT416(0xffff8c48),ZEXT416(0xffff8c48),0);
  auVar37._4_4_ = auVar37._0_4_;
  auVar37._8_4_ = auVar37._0_4_;
  auVar37._12_4_ = auVar37._0_4_;
  auVar64 = pmulhrsw(auVar63,(undefined1  [16])input[4]);
  auVar37 = pmulhrsw(auVar37,(undefined1  [16])input[4]);
  auVar2 = pshuflw(ZEXT416(0x4c40),ZEXT416(0x4c40),0);
  uVar1 = auVar2._0_4_;
  auVar88._4_4_ = uVar1;
  auVar88._0_4_ = uVar1;
  auVar88._8_4_ = uVar1;
  auVar88._12_4_ = uVar1;
  auVar2 = pshuflw(ZEXT416(0xffff9930),ZEXT416(0xffff9930),0);
  uVar1 = auVar2._0_4_;
  auVar119._4_4_ = uVar1;
  auVar119._0_4_ = uVar1;
  auVar119._8_4_ = uVar1;
  auVar119._12_4_ = uVar1;
  auVar89 = pmulhrsw(auVar88,(undefined1  [16])input[6]);
  auVar120 = pmulhrsw(auVar119,(undefined1  [16])input[6]);
  auVar2 = pshuflw(ZEXT416(0x55f8),ZEXT416(0x55f8),0);
  uVar1 = auVar2._0_4_;
  auVar49._4_4_ = uVar1;
  auVar49._0_4_ = uVar1;
  auVar49._8_4_ = uVar1;
  auVar49._12_4_ = uVar1;
  auVar2 = pshuflw(ZEXT416(0x5ed8),ZEXT416(0x5ed8),0);
  uVar1 = auVar2._0_4_;
  auVar76._4_4_ = uVar1;
  auVar76._0_4_ = uVar1;
  auVar76._8_4_ = uVar1;
  auVar76._12_4_ = uVar1;
  auVar50 = pmulhrsw(auVar49,(undefined1  [16])input[7]);
  auVar77 = pmulhrsw(auVar76,(undefined1  [16])input[7]);
  auVar2 = pshuflw(ZEXT416(0x41d0),ZEXT416(0x41d0),0);
  uVar1 = auVar2._0_4_;
  auVar25._4_4_ = uVar1;
  auVar25._0_4_ = uVar1;
  auVar25._8_4_ = uVar1;
  auVar25._12_4_ = uVar1;
  auVar2 = pshuflw(ZEXT416(0x6dc8),ZEXT416(0x6dc8),0);
  uVar1 = auVar2._0_4_;
  auVar129._4_4_ = uVar1;
  auVar129._0_4_ = uVar1;
  auVar129._8_4_ = uVar1;
  auVar129._12_4_ = uVar1;
  auVar26 = pmulhrsw(auVar25,(undefined1  [16])input[5]);
  auVar130 = pmulhrsw(auVar129,(undefined1  [16])input[5]);
  auVar2 = pshuflw(ZEXT416(0x2b20),ZEXT416(0x2b20),0);
  uVar1 = auVar2._0_4_;
  auVar12._4_4_ = uVar1;
  auVar12._0_4_ = uVar1;
  auVar12._8_4_ = uVar1;
  auVar12._12_4_ = uVar1;
  auVar2 = pshuflw(ZEXT416(0x7888),ZEXT416(0x7888),0);
  uVar1 = auVar2._0_4_;
  auVar122._4_4_ = uVar1;
  auVar122._0_4_ = uVar1;
  auVar122._8_4_ = uVar1;
  auVar122._12_4_ = uVar1;
  auVar13 = pmulhrsw(auVar12,(undefined1  [16])input[3]);
  auVar5 = pmulhrsw(auVar122,(undefined1  [16])input[3]);
  auVar2 = pshuflw(ZEXT416(0x12c8),ZEXT416(0x12c8),0);
  uVar1 = auVar2._0_4_;
  auVar51._4_4_ = uVar1;
  auVar51._0_4_ = uVar1;
  auVar51._8_4_ = uVar1;
  auVar51._12_4_ = uVar1;
  auVar2 = pshuflw(ZEXT416(0x7ea0),ZEXT416(0x7ea0),0);
  auVar2._4_4_ = auVar2._0_4_;
  auVar2._8_4_ = auVar2._0_4_;
  auVar2._12_4_ = auVar2._0_4_;
  auVar4 = pmulhrsw(auVar51,(undefined1  [16])input[1]);
  auVar2 = pmulhrsw(auVar2,(undefined1  [16])input[1]);
  auVar109 = paddsw(auVar57,auVar50);
  auVar50 = psubsw(auVar57,auVar50);
  auVar51 = paddsw(auVar39,auVar77);
  auVar39 = psubsw(auVar39,auVar77);
  auVar52 = paddsw(auVar99,auVar26);
  auVar26 = psubsw(auVar99,auVar26);
  auVar27 = paddsw(auVar139,auVar130);
  auVar139 = psubsw(auVar139,auVar130);
  auVar130 = paddsw(auVar64,auVar13);
  auVar57 = psubsw(auVar64,auVar13);
  auVar99 = paddsw(auVar37,auVar5);
  auVar78 = psubsw(auVar37,auVar5);
  auVar77 = paddsw(auVar89,auVar4);
  auVar90 = psubsw(auVar89,auVar4);
  auVar64 = paddsw(auVar120,auVar2);
  auVar121 = psubsw(auVar120,auVar2);
  auVar7._0_12_ = auVar50._0_12_;
  auVar7._12_2_ = auVar50._6_2_;
  auVar7._14_2_ = auVar39._6_2_;
  auVar6._12_4_ = auVar7._12_4_;
  auVar6._0_10_ = auVar50._0_10_;
  auVar6._10_2_ = auVar39._4_2_;
  auVar140._10_6_ = auVar6._10_6_;
  auVar140._0_8_ = auVar50._0_8_;
  auVar140._8_2_ = auVar50._4_2_;
  auVar128._8_8_ = auVar140._8_8_;
  auVar128._6_2_ = auVar39._2_2_;
  auVar128._4_2_ = auVar50._2_2_;
  auVar128._0_2_ = auVar50._0_2_;
  auVar128._2_2_ = auVar39._0_2_;
  auVar58._2_2_ = auVar39._8_2_;
  auVar58._0_2_ = auVar50._8_2_;
  auVar58._4_2_ = auVar50._10_2_;
  auVar58._6_2_ = auVar39._10_2_;
  auVar58._8_2_ = auVar50._12_2_;
  auVar58._10_2_ = auVar39._12_2_;
  auVar58._12_2_ = auVar50._14_2_;
  auVar58._14_2_ = auVar39._14_2_;
  auVar4._8_4_ = 0xf04f031f;
  auVar4._0_8_ = 0xf04f031ff04f031f;
  auVar4._12_4_ = 0xf04f031f;
  auVar2 = pmaddwd(auVar128,auVar4);
  auVar5 = pmaddwd(auVar58,auVar4);
  auVar28._8_4_ = 0x31f0fb1;
  auVar28._0_8_ = 0x31f0fb1031f0fb1;
  auVar28._12_4_ = 0x31f0fb1;
  auVar4 = pmaddwd(auVar128,auVar28);
  auVar37 = pmaddwd(auVar58,auVar28);
  auVar53._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar53._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar53._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar53._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar89._0_4_ = auVar37._0_4_ + 0x800 >> 0xc;
  auVar89._4_4_ = auVar37._4_4_ + 0x800 >> 0xc;
  auVar89._8_4_ = auVar37._8_4_ + 0x800 >> 0xc;
  auVar89._12_4_ = auVar37._12_4_ + 0x800 >> 0xc;
  auVar89 = packssdw(auVar53,auVar89);
  auVar8._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar8._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar8._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar8._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar59._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar59._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar59._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar59._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar2 = packssdw(auVar8,auVar59);
  auVar134._0_12_ = auVar26._0_12_;
  auVar134._12_2_ = auVar26._6_2_;
  auVar134._14_2_ = auVar139._6_2_;
  auVar133._12_4_ = auVar134._12_4_;
  auVar133._0_10_ = auVar26._0_10_;
  auVar133._10_2_ = auVar139._4_2_;
  auVar132._10_6_ = auVar133._10_6_;
  auVar132._0_8_ = auVar26._0_8_;
  auVar132._8_2_ = auVar26._4_2_;
  auVar131._8_8_ = auVar132._8_8_;
  auVar131._6_2_ = auVar139._2_2_;
  auVar131._4_2_ = auVar26._2_2_;
  auVar131._0_2_ = auVar26._0_2_;
  auVar131._2_2_ = auVar139._0_2_;
  auVar100._2_2_ = auVar139._8_2_;
  auVar100._0_2_ = auVar26._8_2_;
  auVar100._4_2_ = auVar26._10_2_;
  auVar100._6_2_ = auVar139._10_2_;
  auVar100._8_2_ = auVar26._12_2_;
  auVar100._10_2_ = auVar139._12_2_;
  auVar100._12_2_ = auVar26._14_2_;
  auVar100._14_2_ = auVar139._14_2_;
  auVar5._8_4_ = 0xf71c0d4e;
  auVar5._0_8_ = 0xf71c0d4ef71c0d4e;
  auVar5._12_4_ = 0xf71c0d4e;
  auVar13 = pmaddwd(auVar131,auVar5);
  auVar5 = pmaddwd(auVar100,auVar5);
  auVar120._8_4_ = 0xd4e08e4;
  auVar120._0_8_ = 0xd4e08e40d4e08e4;
  auVar120._12_4_ = 0xd4e08e4;
  auVar4 = pmaddwd(auVar131,auVar120);
  auVar37 = pmaddwd(auVar100,auVar120);
  auVar60._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar60._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar60._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar60._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar14._0_4_ = auVar37._0_4_ + 0x800 >> 0xc;
  auVar14._4_4_ = auVar37._4_4_ + 0x800 >> 0xc;
  auVar14._8_4_ = auVar37._8_4_ + 0x800 >> 0xc;
  auVar14._12_4_ = auVar37._12_4_ + 0x800 >> 0xc;
  auVar139 = packssdw(auVar60,auVar14);
  auVar135._0_4_ = auVar13._0_4_ + 0x800 >> 0xc;
  auVar135._4_4_ = auVar13._4_4_ + 0x800 >> 0xc;
  auVar135._8_4_ = auVar13._8_4_ + 0x800 >> 0xc;
  auVar135._12_4_ = auVar13._12_4_ + 0x800 >> 0xc;
  auVar101._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar101._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar101._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar101._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar136 = packssdw(auVar135,auVar101);
  auVar26._0_12_ = auVar57._0_12_;
  auVar26._12_2_ = auVar57._6_2_;
  auVar26._14_2_ = auVar78._6_2_;
  auVar13._12_4_ = auVar26._12_4_;
  auVar13._0_10_ = auVar57._0_10_;
  auVar13._10_2_ = auVar78._4_2_;
  auVar50._10_6_ = auVar13._10_6_;
  auVar50._0_8_ = auVar57._0_8_;
  auVar50._8_2_ = auVar57._4_2_;
  auVar39._8_8_ = auVar50._8_8_;
  auVar39._6_2_ = auVar78._2_2_;
  auVar39._4_2_ = auVar57._2_2_;
  auVar39._0_2_ = auVar57._0_2_;
  auVar39._2_2_ = auVar78._0_2_;
  auVar65._2_2_ = auVar78._8_2_;
  auVar65._0_2_ = auVar57._8_2_;
  auVar65._4_2_ = auVar57._10_2_;
  auVar65._6_2_ = auVar78._10_2_;
  auVar65._8_2_ = auVar57._12_2_;
  auVar65._10_2_ = auVar78._12_2_;
  auVar65._12_2_ = auVar57._14_2_;
  auVar65._14_2_ = auVar78._14_2_;
  auVar15._8_4_ = 0xfb1fce1;
  auVar15._0_8_ = 0xfb1fce10fb1fce1;
  auVar15._12_4_ = 0xfb1fce1;
  auVar5 = pmaddwd(auVar39,auVar15);
  auVar4 = pmaddwd(auVar15,auVar65);
  auVar37 = pmaddwd(auVar39,auVar28);
  auVar26 = pmaddwd(auVar65,auVar28);
  auVar40._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar40._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar40._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar40._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar16._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar16._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar16._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar16._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar13 = packssdw(auVar40,auVar16);
  auVar57._0_4_ = auVar37._0_4_ + 0x800 >> 0xc;
  auVar57._4_4_ = auVar37._4_4_ + 0x800 >> 0xc;
  auVar57._8_4_ = auVar37._8_4_ + 0x800 >> 0xc;
  auVar57._12_4_ = auVar37._12_4_ + 0x800 >> 0xc;
  auVar66._0_4_ = auVar26._0_4_ + 0x800 >> 0xc;
  auVar66._4_4_ = auVar26._4_4_ + 0x800 >> 0xc;
  auVar66._8_4_ = auVar26._8_4_ + 0x800 >> 0xc;
  auVar66._12_4_ = auVar26._12_4_ + 0x800 >> 0xc;
  auVar37 = packssdw(auVar57,auVar66);
  auVar32._0_12_ = auVar90._0_12_;
  auVar32._12_2_ = auVar90._6_2_;
  auVar32._14_2_ = auVar121._6_2_;
  auVar31._12_4_ = auVar32._12_4_;
  auVar31._0_10_ = auVar90._0_10_;
  auVar31._10_2_ = auVar121._4_2_;
  auVar30._10_6_ = auVar31._10_6_;
  auVar30._0_8_ = auVar90._0_8_;
  auVar30._8_2_ = auVar90._4_2_;
  auVar29._8_8_ = auVar30._8_8_;
  auVar29._6_2_ = auVar121._2_2_;
  auVar29._4_2_ = auVar90._2_2_;
  auVar29._0_2_ = auVar90._0_2_;
  auVar29._2_2_ = auVar121._0_2_;
  auVar91._2_2_ = auVar121._8_2_;
  auVar91._0_2_ = auVar90._8_2_;
  auVar91._4_2_ = auVar90._10_2_;
  auVar91._6_2_ = auVar121._10_2_;
  auVar91._8_2_ = auVar90._12_2_;
  auVar91._10_2_ = auVar121._12_2_;
  auVar91._12_2_ = auVar90._14_2_;
  auVar91._14_2_ = auVar121._14_2_;
  auVar17._8_4_ = 0x8e4f2b2;
  auVar17._0_8_ = 0x8e4f2b208e4f2b2;
  auVar17._12_4_ = 0x8e4f2b2;
  auVar26 = pmaddwd(auVar29,auVar17);
  auVar4 = pmaddwd(auVar17,auVar91);
  auVar5 = pmaddwd(auVar29,auVar120);
  auVar39 = pmaddwd(auVar91,auVar120);
  auVar67._0_4_ = auVar26._0_4_ + 0x800 >> 0xc;
  auVar67._4_4_ = auVar26._4_4_ + 0x800 >> 0xc;
  auVar67._8_4_ = auVar26._8_4_ + 0x800 >> 0xc;
  auVar67._12_4_ = auVar26._12_4_ + 0x800 >> 0xc;
  auVar18._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar18._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar18._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar18._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar50 = packssdw(auVar67,auVar18);
  auVar33._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar33._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar33._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar33._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar92._0_4_ = auVar39._0_4_ + 0x800 >> 0xc;
  auVar92._4_4_ = auVar39._4_4_ + 0x800 >> 0xc;
  auVar92._8_4_ = auVar39._8_4_ + 0x800 >> 0xc;
  auVar92._12_4_ = auVar39._12_4_ + 0x800 >> 0xc;
  auVar26 = packssdw(auVar33,auVar92);
  auVar120 = paddsw(auVar109,auVar130);
  auVar130 = psubsw(auVar109,auVar130);
  auVar121 = paddsw(auVar51,auVar99);
  auVar4 = psubsw(auVar51,auVar99);
  auVar51 = paddsw(auVar52,auVar77);
  auVar77 = psubsw(auVar52,auVar77);
  auVar122 = paddsw(auVar27,auVar64);
  auVar5 = psubsw(auVar27,auVar64);
  auVar140 = paddsw(auVar89,auVar13);
  auVar39 = psubsw(auVar89,auVar13);
  auVar27 = paddsw(auVar2,auVar37);
  auVar13 = psubsw(auVar2,auVar37);
  auVar37 = paddsw(auVar139,auVar50);
  auVar57 = psubsw(auVar139,auVar50);
  auVar2 = paddsw(auVar136,auVar26);
  auVar99 = psubsw(auVar136,auVar26);
  auVar126._0_12_ = auVar130._0_12_;
  auVar126._12_2_ = auVar130._6_2_;
  auVar126._14_2_ = auVar4._6_2_;
  auVar125._12_4_ = auVar126._12_4_;
  auVar125._0_10_ = auVar130._0_10_;
  auVar125._10_2_ = auVar4._4_2_;
  auVar124._10_6_ = auVar125._10_6_;
  auVar124._0_8_ = auVar130._0_8_;
  auVar124._8_2_ = auVar130._4_2_;
  auVar123._8_8_ = auVar124._8_8_;
  auVar123._6_2_ = auVar4._2_2_;
  auVar123._4_2_ = auVar130._2_2_;
  auVar123._0_2_ = auVar130._0_2_;
  auVar123._2_2_ = auVar4._0_2_;
  auVar110._2_2_ = auVar4._8_2_;
  auVar110._0_2_ = auVar130._8_2_;
  auVar110._4_2_ = auVar130._10_2_;
  auVar110._6_2_ = auVar4._10_2_;
  auVar110._8_2_ = auVar130._12_2_;
  auVar110._10_2_ = auVar4._12_2_;
  auVar110._12_2_ = auVar130._14_2_;
  auVar110._14_2_ = auVar4._14_2_;
  auVar34._8_4_ = 0x61f0ec8;
  auVar34._0_8_ = 0x61f0ec8061f0ec8;
  auVar34._12_4_ = 0x61f0ec8;
  auVar26 = pmaddwd(auVar123,auVar34);
  auVar4 = pmaddwd(auVar110,auVar34);
  auVar93._0_4_ = auVar26._0_4_ + 0x800 >> 0xc;
  auVar93._4_4_ = auVar26._4_4_ + 0x800 >> 0xc;
  auVar93._8_4_ = auVar26._8_4_ + 0x800 >> 0xc;
  auVar93._12_4_ = auVar26._12_4_ + 0x800 >> 0xc;
  auVar64._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar64._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar64._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar64._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar136 = packssdw(auVar93,auVar64);
  auVar68._8_4_ = 0xf138061f;
  auVar68._0_8_ = 0xf138061ff138061f;
  auVar68._12_4_ = 0xf138061f;
  auVar26 = pmaddwd(auVar123,auVar68);
  auVar4 = pmaddwd(auVar110,auVar68);
  auVar127._0_4_ = auVar26._0_4_ + 0x800 >> 0xc;
  auVar127._4_4_ = auVar26._4_4_ + 0x800 >> 0xc;
  auVar127._8_4_ = auVar26._8_4_ + 0x800 >> 0xc;
  auVar127._12_4_ = auVar26._12_4_ + 0x800 >> 0xc;
  auVar111._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar111._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar111._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar111._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar128 = packssdw(auVar127,auVar111);
  auVar90._0_12_ = auVar77._0_12_;
  auVar90._12_2_ = auVar77._6_2_;
  auVar90._14_2_ = auVar5._6_2_;
  auVar78._12_4_ = auVar90._12_4_;
  auVar78._0_10_ = auVar77._0_10_;
  auVar78._10_2_ = auVar5._4_2_;
  auVar139._10_6_ = auVar78._10_6_;
  auVar139._0_8_ = auVar77._0_8_;
  auVar139._8_2_ = auVar77._4_2_;
  auVar52._8_8_ = auVar139._8_8_;
  auVar52._6_2_ = auVar5._2_2_;
  auVar52._4_2_ = auVar77._2_2_;
  auVar52._0_2_ = auVar77._0_2_;
  auVar52._2_2_ = auVar5._0_2_;
  auVar102._2_2_ = auVar5._8_2_;
  auVar102._0_2_ = auVar77._8_2_;
  auVar102._4_2_ = auVar77._10_2_;
  auVar102._6_2_ = auVar5._10_2_;
  auVar102._8_2_ = auVar77._12_2_;
  auVar102._10_2_ = auVar5._12_2_;
  auVar102._12_2_ = auVar77._14_2_;
  auVar102._14_2_ = auVar5._14_2_;
  auVar77._8_4_ = 0xec8f9e1;
  auVar77._0_8_ = 0xec8f9e10ec8f9e1;
  auVar77._12_4_ = 0xec8f9e1;
  auVar4 = pmaddwd(auVar52,auVar77);
  auVar5 = pmaddwd(auVar102,auVar77);
  auVar19._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar19._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar19._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar19._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar41._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar41._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar41._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar41._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar26 = packssdw(auVar19,auVar41);
  auVar4 = pmaddwd(auVar52,auVar34);
  auVar5 = pmaddwd(auVar102,auVar34);
  auVar109._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar109._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar109._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar109._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar42._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar42._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar42._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar42._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar5 = packssdw(auVar109,auVar42);
  auVar46._0_12_ = auVar39._0_12_;
  auVar46._12_2_ = auVar39._6_2_;
  auVar46._14_2_ = auVar13._6_2_;
  auVar45._12_4_ = auVar46._12_4_;
  auVar45._0_10_ = auVar39._0_10_;
  auVar45._10_2_ = auVar13._4_2_;
  auVar44._10_6_ = auVar45._10_6_;
  auVar44._0_8_ = auVar39._0_8_;
  auVar44._8_2_ = auVar39._4_2_;
  auVar43._8_8_ = auVar44._8_8_;
  auVar43._6_2_ = auVar13._2_2_;
  auVar43._4_2_ = auVar39._2_2_;
  auVar43._0_2_ = auVar39._0_2_;
  auVar43._2_2_ = auVar13._0_2_;
  auVar54._2_2_ = auVar13._8_2_;
  auVar54._0_2_ = auVar39._8_2_;
  auVar54._4_2_ = auVar39._10_2_;
  auVar54._6_2_ = auVar13._10_2_;
  auVar54._8_2_ = auVar39._12_2_;
  auVar54._10_2_ = auVar13._12_2_;
  auVar54._12_2_ = auVar39._14_2_;
  auVar54._14_2_ = auVar13._14_2_;
  auVar39 = pmaddwd(auVar43,auVar68);
  auVar50 = pmaddwd(auVar54,auVar68);
  auVar4 = pmaddwd(auVar43,auVar34);
  auVar13 = pmaddwd(auVar54,auVar34);
  auVar9._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar9._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar9._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar9._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar112._0_4_ = auVar13._0_4_ + 0x800 >> 0xc;
  auVar112._4_4_ = auVar13._4_4_ + 0x800 >> 0xc;
  auVar112._8_4_ = auVar13._8_4_ + 0x800 >> 0xc;
  auVar112._12_4_ = auVar13._12_4_ + 0x800 >> 0xc;
  auVar13 = packssdw(auVar9,auVar112);
  auVar47._0_4_ = auVar39._0_4_ + 0x800 >> 0xc;
  auVar47._4_4_ = auVar39._4_4_ + 0x800 >> 0xc;
  auVar47._8_4_ = auVar39._8_4_ + 0x800 >> 0xc;
  auVar47._12_4_ = auVar39._12_4_ + 0x800 >> 0xc;
  auVar55._0_4_ = auVar50._0_4_ + 0x800 >> 0xc;
  auVar55._4_4_ = auVar50._4_4_ + 0x800 >> 0xc;
  auVar55._8_4_ = auVar50._8_4_ + 0x800 >> 0xc;
  auVar55._12_4_ = auVar50._12_4_ + 0x800 >> 0xc;
  auVar130 = packssdw(auVar47,auVar55);
  auVar116._0_12_ = auVar57._0_12_;
  auVar116._12_2_ = auVar57._6_2_;
  auVar116._14_2_ = auVar99._6_2_;
  auVar115._12_4_ = auVar116._12_4_;
  auVar115._0_10_ = auVar57._0_10_;
  auVar115._10_2_ = auVar99._4_2_;
  auVar114._10_6_ = auVar115._10_6_;
  auVar114._0_8_ = auVar57._0_8_;
  auVar114._8_2_ = auVar57._4_2_;
  auVar113._8_8_ = auVar114._8_8_;
  auVar113._6_2_ = auVar99._2_2_;
  auVar113._4_2_ = auVar57._2_2_;
  auVar113._0_2_ = auVar57._0_2_;
  auVar113._2_2_ = auVar99._0_2_;
  auVar61._2_2_ = auVar99._8_2_;
  auVar61._0_2_ = auVar57._8_2_;
  auVar61._4_2_ = auVar57._10_2_;
  auVar61._6_2_ = auVar99._10_2_;
  auVar61._8_2_ = auVar57._12_2_;
  auVar61._10_2_ = auVar99._12_2_;
  auVar61._12_2_ = auVar57._14_2_;
  auVar61._14_2_ = auVar99._14_2_;
  auVar50 = pmaddwd(auVar113,auVar77);
  auVar4 = pmaddwd(auVar77,auVar61);
  auVar57 = pmaddwd(auVar113,auVar34);
  auVar39 = pmaddwd(auVar61,auVar34);
  auVar69._0_4_ = auVar50._0_4_ + 0x800 >> 0xc;
  auVar69._4_4_ = auVar50._4_4_ + 0x800 >> 0xc;
  auVar69._8_4_ = auVar50._8_4_ + 0x800 >> 0xc;
  auVar69._12_4_ = auVar50._12_4_ + 0x800 >> 0xc;
  auVar99._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar99._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar99._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar99._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar99 = packssdw(auVar69,auVar99);
  auVar117._0_4_ = auVar57._0_4_ + 0x800 >> 0xc;
  auVar117._4_4_ = auVar57._4_4_ + 0x800 >> 0xc;
  auVar117._8_4_ = auVar57._8_4_ + 0x800 >> 0xc;
  auVar117._12_4_ = auVar57._12_4_ + 0x800 >> 0xc;
  auVar62._0_4_ = auVar39._0_4_ + 0x800 >> 0xc;
  auVar62._4_4_ = auVar39._4_4_ + 0x800 >> 0xc;
  auVar62._8_4_ = auVar39._8_4_ + 0x800 >> 0xc;
  auVar62._12_4_ = auVar39._12_4_ + 0x800 >> 0xc;
  auVar52 = packssdw(auVar117,auVar62);
  auVar57 = paddsw(auVar120,auVar51);
  auVar89 = psubsw(auVar120,auVar51);
  auVar64 = paddsw(auVar121,auVar122);
  auVar4 = psubsw(auVar121,auVar122);
  auVar77 = paddsw(auVar136,auVar26);
  auVar120 = psubsw(auVar136,auVar26);
  auVar26 = paddsw(auVar128,auVar5);
  auVar139 = psubsw(auVar128,auVar5);
  auVar39 = paddsw(auVar140,auVar37);
  auVar78 = psubsw(auVar140,auVar37);
  auVar50 = paddsw(auVar27,auVar2);
  auVar51 = psubsw(auVar27,auVar2);
  alVar137 = (__m128i)paddsw(auVar13,auVar99);
  auVar5 = psubsw(auVar13,auVar99);
  auVar2 = paddsw(auVar130,auVar52);
  auVar99 = psubsw(auVar130,auVar52);
  auVar106._0_12_ = auVar89._0_12_;
  auVar106._12_2_ = auVar89._6_2_;
  auVar106._14_2_ = auVar4._6_2_;
  auVar105._12_4_ = auVar106._12_4_;
  auVar105._0_10_ = auVar89._0_10_;
  auVar105._10_2_ = auVar4._4_2_;
  auVar104._10_6_ = auVar105._10_6_;
  auVar104._0_8_ = auVar89._0_8_;
  auVar104._8_2_ = auVar89._4_2_;
  auVar103._8_8_ = auVar104._8_8_;
  auVar103._6_2_ = auVar4._2_2_;
  auVar103._4_2_ = auVar89._2_2_;
  auVar103._0_2_ = auVar89._0_2_;
  auVar103._2_2_ = auVar4._0_2_;
  auVar79._2_2_ = auVar4._8_2_;
  auVar79._0_2_ = auVar89._8_2_;
  auVar79._4_2_ = auVar89._10_2_;
  auVar79._6_2_ = auVar4._10_2_;
  auVar79._8_2_ = auVar89._12_2_;
  auVar79._10_2_ = auVar4._12_2_;
  auVar79._12_2_ = auVar89._14_2_;
  auVar79._14_2_ = auVar4._14_2_;
  auVar27._8_4_ = 0xb500b50;
  auVar27._0_8_ = 0xb500b500b500b50;
  auVar27._12_4_ = 0xb500b50;
  auVar4 = pmaddwd(auVar103,auVar27);
  auVar37 = pmaddwd(auVar79,auVar27);
  auVar118._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar118._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar118._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar118._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar121._0_4_ = auVar37._0_4_ + 0x800 >> 0xc;
  auVar121._4_4_ = auVar37._4_4_ + 0x800 >> 0xc;
  auVar121._8_4_ = auVar37._8_4_ + 0x800 >> 0xc;
  auVar121._12_4_ = auVar37._12_4_ + 0x800 >> 0xc;
  auVar89 = packssdw(auVar118,auVar121);
  auVar136._8_4_ = 0xf4b00b50;
  auVar136._0_8_ = 0xf4b00b50f4b00b50;
  auVar136._12_4_ = 0xf4b00b50;
  auVar4 = pmaddwd(auVar103,auVar136);
  auVar37 = pmaddwd(auVar79,auVar136);
  auVar107._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar107._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar107._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar107._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar80._0_4_ = auVar37._0_4_ + 0x800 >> 0xc;
  auVar80._4_4_ = auVar37._4_4_ + 0x800 >> 0xc;
  auVar80._8_4_ = auVar37._8_4_ + 0x800 >> 0xc;
  auVar80._12_4_ = auVar37._12_4_ + 0x800 >> 0xc;
  alVar108 = (__m128i)packssdw(auVar107,auVar80);
  auVar23._0_12_ = auVar120._0_12_;
  auVar23._12_2_ = auVar120._6_2_;
  auVar23._14_2_ = auVar139._6_2_;
  auVar22._12_4_ = auVar23._12_4_;
  auVar22._0_10_ = auVar120._0_10_;
  auVar22._10_2_ = auVar139._4_2_;
  auVar21._10_6_ = auVar22._10_6_;
  auVar21._0_8_ = auVar120._0_8_;
  auVar21._8_2_ = auVar120._4_2_;
  auVar20._8_8_ = auVar21._8_8_;
  auVar20._6_2_ = auVar139._2_2_;
  auVar20._4_2_ = auVar120._2_2_;
  auVar20._0_2_ = auVar120._0_2_;
  auVar20._2_2_ = auVar139._0_2_;
  auVar94._2_2_ = auVar139._8_2_;
  auVar94._0_2_ = auVar120._8_2_;
  auVar94._4_2_ = auVar120._10_2_;
  auVar94._6_2_ = auVar139._10_2_;
  auVar94._8_2_ = auVar120._12_2_;
  auVar94._10_2_ = auVar139._12_2_;
  auVar94._12_2_ = auVar120._14_2_;
  auVar94._14_2_ = auVar139._14_2_;
  auVar37 = pmaddwd(auVar20,auVar27);
  auVar4 = pmaddwd(auVar94,auVar27);
  auVar35._0_4_ = auVar37._0_4_ + 0x800 >> 0xc;
  auVar35._4_4_ = auVar37._4_4_ + 0x800 >> 0xc;
  auVar35._8_4_ = auVar37._8_4_ + 0x800 >> 0xc;
  auVar35._12_4_ = auVar37._12_4_ + 0x800 >> 0xc;
  auVar70._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar70._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar70._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar70._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  alVar36 = (__m128i)packssdw(auVar35,auVar70);
  auVar37 = pmaddwd(auVar20,auVar136);
  auVar4 = pmaddwd(auVar94,auVar136);
  auVar24._0_4_ = auVar37._0_4_ + 0x800 >> 0xc;
  auVar24._4_4_ = auVar37._4_4_ + 0x800 >> 0xc;
  auVar24._8_4_ = auVar37._8_4_ + 0x800 >> 0xc;
  auVar24._12_4_ = auVar37._12_4_ + 0x800 >> 0xc;
  auVar95._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar95._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar95._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar95._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar13 = packssdw(auVar24,auVar95);
  auVar74._0_12_ = auVar78._0_12_;
  auVar74._12_2_ = auVar78._6_2_;
  auVar74._14_2_ = auVar51._6_2_;
  auVar73._12_4_ = auVar74._12_4_;
  auVar73._0_10_ = auVar78._0_10_;
  auVar73._10_2_ = auVar51._4_2_;
  auVar72._10_6_ = auVar73._10_6_;
  auVar72._0_8_ = auVar78._0_8_;
  auVar72._8_2_ = auVar78._4_2_;
  auVar71._8_8_ = auVar72._8_8_;
  auVar71._6_2_ = auVar51._2_2_;
  auVar71._4_2_ = auVar78._2_2_;
  auVar71._0_2_ = auVar78._0_2_;
  auVar71._2_2_ = auVar51._0_2_;
  auVar141._2_2_ = auVar51._8_2_;
  auVar141._0_2_ = auVar78._8_2_;
  auVar141._4_2_ = auVar78._10_2_;
  auVar141._6_2_ = auVar51._10_2_;
  auVar141._8_2_ = auVar78._12_2_;
  auVar141._10_2_ = auVar51._12_2_;
  auVar141._12_2_ = auVar78._14_2_;
  auVar141._14_2_ = auVar51._14_2_;
  auVar4 = pmaddwd(auVar71,auVar27);
  auVar37 = pmaddwd(auVar141,auVar27);
  auVar96._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar96._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar96._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar96._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar81._0_4_ = auVar37._0_4_ + 0x800 >> 0xc;
  auVar81._4_4_ = auVar37._4_4_ + 0x800 >> 0xc;
  auVar81._8_4_ = auVar37._8_4_ + 0x800 >> 0xc;
  auVar81._12_4_ = auVar37._12_4_ + 0x800 >> 0xc;
  alVar97 = (__m128i)packssdw(auVar96,auVar81);
  auVar37 = pmaddwd(auVar71,auVar136);
  auVar4 = pmaddwd(auVar141,auVar136);
  auVar75._0_4_ = auVar37._0_4_ + 0x800 >> 0xc;
  auVar75._4_4_ = auVar37._4_4_ + 0x800 >> 0xc;
  auVar75._8_4_ = auVar37._8_4_ + 0x800 >> 0xc;
  auVar75._12_4_ = auVar37._12_4_ + 0x800 >> 0xc;
  auVar142._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar142._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar142._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar142._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar51 = packssdw(auVar75,auVar142);
  auVar85._0_12_ = auVar5._0_12_;
  auVar85._12_2_ = auVar5._6_2_;
  auVar85._14_2_ = auVar99._6_2_;
  auVar84._12_4_ = auVar85._12_4_;
  auVar84._0_10_ = auVar5._0_10_;
  auVar84._10_2_ = auVar99._4_2_;
  auVar83._10_6_ = auVar84._10_6_;
  auVar83._0_8_ = auVar5._0_8_;
  auVar83._8_2_ = auVar5._4_2_;
  auVar82._8_8_ = auVar83._8_8_;
  auVar82._6_2_ = auVar99._2_2_;
  auVar82._4_2_ = auVar5._2_2_;
  auVar82._0_2_ = auVar5._0_2_;
  auVar82._2_2_ = auVar99._0_2_;
  auVar10._2_2_ = auVar99._8_2_;
  auVar10._0_2_ = auVar5._8_2_;
  auVar10._4_2_ = auVar5._10_2_;
  auVar10._6_2_ = auVar99._10_2_;
  auVar10._8_2_ = auVar5._12_2_;
  auVar10._10_2_ = auVar99._12_2_;
  auVar10._12_2_ = auVar5._14_2_;
  auVar10._14_2_ = auVar99._14_2_;
  auVar5 = pmaddwd(auVar82,auVar27);
  auVar37 = pmaddwd(auVar27,auVar10);
  auVar99 = pmaddwd(auVar82,auVar136);
  auVar4 = pmaddwd(auVar10,auVar136);
  auVar48._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar48._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar48._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar48._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar130._0_4_ = auVar37._0_4_ + 0x800 >> 0xc;
  auVar130._4_4_ = auVar37._4_4_ + 0x800 >> 0xc;
  auVar130._8_4_ = auVar37._8_4_ + 0x800 >> 0xc;
  auVar130._12_4_ = auVar37._12_4_ + 0x800 >> 0xc;
  auVar37 = packssdw(auVar48,auVar130);
  auVar86._0_4_ = auVar99._0_4_ + 0x800 >> 0xc;
  auVar86._4_4_ = auVar99._4_4_ + 0x800 >> 0xc;
  auVar86._8_4_ = auVar99._8_4_ + 0x800 >> 0xc;
  auVar86._12_4_ = auVar99._12_4_ + 0x800 >> 0xc;
  auVar11._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar11._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar11._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar11._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  alVar87 = (__m128i)packssdw(auVar86,auVar11);
  local_18 = auVar57._0_8_;
  lStack_10 = auVar57._8_8_;
  (*output)[0] = local_18;
  (*output)[1] = lStack_10;
  alVar3 = (__m128i)psubsw((undefined1  [16])0x0,auVar39);
  output[1] = alVar3;
  output[2] = alVar137;
  alVar3 = (__m128i)psubsw((undefined1  [16])0x0,auVar77);
  output[3] = alVar3;
  output[4] = alVar36;
  alVar3 = (__m128i)psubsw((undefined1  [16])0x0,auVar37);
  output[5] = alVar3;
  output[6] = alVar97;
  alVar3 = (__m128i)psubsw((undefined1  [16])0x0,auVar89);
  output[7] = alVar3;
  output[8] = alVar108;
  alVar3 = (__m128i)psubsw((undefined1  [16])0x0,auVar51);
  output[9] = alVar3;
  output[10] = alVar87;
  alVar3 = (__m128i)psubsw((undefined1  [16])0x0,auVar13);
  output[0xb] = alVar3;
  local_68 = auVar26._0_8_;
  lStack_60 = auVar26._8_8_;
  output[0xc][0] = local_68;
  output[0xc][1] = lStack_60;
  alVar3 = (__m128i)psubsw((undefined1  [16])0x0,auVar2);
  output[0xd] = alVar3;
  local_78 = auVar50._0_8_;
  lStack_70 = auVar50._8_8_;
  output[0xe][0] = local_78;
  output[0xe][1] = lStack_70;
  alVar3 = (__m128i)psubsw((undefined1  [16])0x0,auVar64);
  output[0xf] = alVar3;
  return;
}

Assistant:

static void iadst16_low8_ssse3(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  // stage 1
  __m128i x[16];
  x[1] = input[0];
  x[3] = input[2];
  x[5] = input[4];
  x[7] = input[6];
  x[8] = input[7];
  x[10] = input[5];
  x[12] = input[3];
  x[14] = input[1];

  // stage 2
  btf_16_ssse3(cospi[62], -cospi[2], x[1], x[0], x[1]);
  btf_16_ssse3(cospi[54], -cospi[10], x[3], x[2], x[3]);
  btf_16_ssse3(cospi[46], -cospi[18], x[5], x[4], x[5]);
  btf_16_ssse3(cospi[38], -cospi[26], x[7], x[6], x[7]);
  btf_16_ssse3(cospi[34], cospi[30], x[8], x[8], x[9]);
  btf_16_ssse3(cospi[42], cospi[22], x[10], x[10], x[11]);
  btf_16_ssse3(cospi[50], cospi[14], x[12], x[12], x[13]);
  btf_16_ssse3(cospi[58], cospi[6], x[14], x[14], x[15]);

  // stage 3
  iadst16_stage3_ssse3(x);
  iadst16_stage4_ssse3(x, cospi, __rounding, cos_bit);
  iadst16_stage5_ssse3(x);
  iadst16_stage6_ssse3(x, cospi, __rounding, cos_bit);
  iadst16_stage7_ssse3(x);
  iadst16_stage8_ssse3(x, cospi, __rounding, cos_bit);
  iadst16_stage9_ssse3(output, x);
}